

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

void __thiscall Polynom<Rational>::extend(Polynom<Rational> *this,uint sz)

{
  uint *puVar1;
  uint width;
  Matrix<Rational> local_30;
  Matrix<Rational> local_20;
  
  puVar1 = &(this->m).N;
  width = sz - *puVar1;
  if (*puVar1 <= sz && width != 0) {
    Matrix<Rational>::Matrix(&local_20,1,width);
    Matrix<Rational>::joinHorizontal(&local_30,&local_20);
    Matrix<Rational>::operator=(&this->m,&local_30);
    Matrix<Rational>::~Matrix(&local_30);
    Matrix<Rational>::~Matrix(&local_20);
  }
  return;
}

Assistant:

void Polynom<Field>::extend(unsigned sz)
{
    if(sz > m.width())
        m = Matrix<Field>(1, sz - m.width()).joinHorizontal(m);
}